

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O0

void __thiscall jrtplib::RTPSourceData::~RTPSourceData(RTPSourceData *this)

{
  uint8_t *buf;
  RTPAddress *pRVar1;
  RTPMemoryManager *pRVar2;
  RTPSourceData *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSourceData_00193cb8;
  FlushPackets(this);
  if (this->byereason != (uint8_t *)0x0) {
    buf = this->byereason;
    pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDeleteByteArray(buf,pRVar2);
  }
  if (this->rtpaddr != (RTPAddress *)0x0) {
    pRVar1 = this->rtpaddr;
    pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPAddress>(pRVar1,pRVar2);
  }
  if (this->rtcpaddr != (RTPAddress *)0x0) {
    pRVar1 = this->rtcpaddr;
    pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPAddress>(pRVar1,pRVar2);
  }
  RTCPSDESInfo::~RTCPSDESInfo(&this->SDESinf);
  std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::~list
            (&this->packetlist);
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

RTPSourceData::~RTPSourceData()
{
	FlushPackets();
	if (byereason)
		RTPDeleteByteArray(byereason,GetMemoryManager());
	if (rtpaddr)
		RTPDelete(rtpaddr,GetMemoryManager());
	if (rtcpaddr)
		RTPDelete(rtcpaddr,GetMemoryManager());
}